

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O1

void compute_response_layer(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  bool *pbVar7;
  float *pfVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  float *data;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int width;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  int iVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  
  iVar1 = layer->height;
  if (0 < iVar1) {
    pfVar6 = layer->response;
    pbVar7 = layer->laplacian;
    iVar2 = layer->step;
    iVar3 = layer->filter_size;
    iVar4 = layer->width;
    iVar11 = iVar3 / 3;
    iVar27 = (iVar3 + -1) - (iVar3 + -1 >> 0x1f) >> 1;
    fVar50 = 1.0 / (float)(iVar3 * iVar3);
    iVar12 = iVar3 / 6;
    iVar37 = 0;
    iVar20 = 0;
    auVar46 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
    do {
      if (0 < iVar4) {
        iVar28 = iVar20 * iVar2;
        iVar38 = iVar28 - iVar11;
        iVar39 = iimage->data_width;
        iVar5 = iimage->height;
        iVar13 = iVar38 + 1;
        if (iVar5 < iVar38 + 1) {
          iVar13 = iVar5;
        }
        iVar40 = iVar38 + iVar11 * 2;
        if (iVar5 <= iVar40) {
          iVar40 = iVar5;
        }
        iVar45 = (iVar13 + -1) * iVar39;
        iVar21 = (iVar40 + -1) * iVar39;
        iVar22 = iVar28 - iVar27;
        iVar14 = iVar22;
        if (iVar5 < iVar22) {
          iVar14 = iVar5;
        }
        iVar15 = iVar22 + iVar3;
        if (iVar5 <= iVar22 + iVar3) {
          iVar15 = iVar5;
        }
        iVar32 = (iVar14 + -1) * iVar39;
        iVar23 = (iVar15 + -1) * iVar39;
        iVar24 = iVar28 - iVar12;
        iVar22 = iVar24;
        if (iVar5 < iVar24) {
          iVar22 = iVar5;
        }
        iVar16 = iVar24 + iVar11;
        if (iVar5 <= iVar24 + iVar11) {
          iVar16 = iVar5;
        }
        iVar33 = (iVar22 + -1) * iVar39;
        iVar24 = (iVar16 + -1) * iVar39;
        if (iVar5 < iVar38) {
          iVar38 = iVar5;
        }
        iVar17 = iVar5;
        if (iVar28 < iVar5) {
          iVar17 = iVar28;
        }
        iVar25 = (iVar38 + -1) * iVar39;
        iVar26 = (iVar17 + -1) * iVar39;
        iVar18 = iVar28 + 1;
        if (iVar5 < iVar28 + 1) {
          iVar18 = iVar5;
        }
        iVar28 = iVar28 + 1 + iVar11;
        if (iVar28 < iVar5) {
          iVar5 = iVar28;
        }
        iVar29 = (iVar18 + -1) * iVar39;
        iVar39 = (iVar5 + -1) * iVar39;
        pfVar8 = iimage->data;
        iVar28 = iimage->width;
        iVar34 = 0;
        lVar44 = 0;
        do {
          iVar42 = iVar34 - iVar27;
          if (iVar28 < iVar34 - iVar27) {
            iVar42 = iVar28;
          }
          iVar19 = (iVar3 - iVar27) + iVar34;
          if (iVar28 <= iVar19) {
            iVar19 = iVar28;
          }
          fVar51 = 0.0;
          fVar54 = 0.0;
          if ((0 < iVar13) && (0 < iVar42)) {
            fVar54 = pfVar8[iVar45 + iVar42 + -1];
          }
          if ((0 < iVar13) && (0 < iVar19)) {
            fVar51 = pfVar8[iVar45 + iVar19 + -1];
          }
          fVar52 = 0.0;
          fVar53 = 0.0;
          if ((0 < iVar40) && (0 < iVar42)) {
            fVar53 = pfVar8[iVar42 + -1 + iVar21];
          }
          if ((0 < iVar40) && (0 < iVar19)) {
            fVar52 = pfVar8[iVar19 + -1 + iVar21];
          }
          iVar42 = iVar34 - iVar12;
          if (iVar28 < iVar34 - iVar12) {
            iVar42 = iVar28;
          }
          iVar19 = (iVar11 - iVar12) + iVar34;
          if (iVar28 <= iVar19) {
            iVar19 = iVar28;
          }
          auVar56 = ZEXT816(0) << 0x40;
          fVar55 = 0.0;
          if ((0 < iVar13) && (0 < iVar42)) {
            fVar55 = pfVar8[iVar45 + iVar42 + -1];
          }
          fVar57 = 0.0;
          if ((0 < iVar13) && (0 < iVar19)) {
            fVar57 = pfVar8[iVar45 + iVar19 + -1];
          }
          fVar58 = 0.0;
          fVar59 = 0.0;
          if ((0 < iVar40) && (0 < iVar42)) {
            fVar59 = pfVar8[iVar42 + -1 + iVar21];
          }
          if ((0 < iVar40) && (0 < iVar19)) {
            fVar58 = pfVar8[iVar19 + -1 + iVar21];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar54 - fVar51) - fVar53) + fVar52)),auVar56);
          iVar42 = -iVar11 + 1 + iVar34;
          if (iVar28 < iVar42) {
            iVar42 = iVar28;
          }
          iVar35 = iVar42 + -1;
          iVar19 = iVar11 + iVar34;
          if (iVar28 <= iVar11 + iVar34) {
            iVar19 = iVar28;
          }
          fVar51 = 0.0;
          auVar47 = vmaxss_avx(ZEXT416((uint)(fVar58 + ((fVar55 - fVar57) - fVar59))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar47,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar54 = 0.0;
          if ((0 < iVar14) && (0 < iVar42)) {
            fVar54 = pfVar8[iVar32 + iVar35];
          }
          iVar30 = iVar19 + -1;
          if ((0 < iVar14) && (0 < iVar19)) {
            fVar51 = pfVar8[iVar32 + iVar30];
          }
          fVar52 = 0.0;
          fVar53 = 0.0;
          if ((0 < iVar15) && (0 < iVar42)) {
            fVar53 = pfVar8[iVar23 + iVar35];
          }
          if ((0 < iVar15) && (0 < iVar19)) {
            fVar52 = pfVar8[iVar23 + iVar30];
          }
          if ((0 < iVar22) && (0 < iVar42)) {
            auVar56 = ZEXT416((uint)pfVar8[iVar33 + iVar35]);
          }
          fVar55 = 0.0;
          if ((0 < iVar22) && (0 < iVar19)) {
            fVar55 = pfVar8[iVar33 + iVar30];
          }
          fVar59 = 0.0;
          fVar57 = 0.0;
          if ((0 < iVar16) && (0 < iVar42)) {
            fVar57 = pfVar8[iVar35 + iVar24];
          }
          if ((0 < iVar16) && (0 < iVar19)) {
            fVar59 = pfVar8[iVar30 + iVar24];
          }
          auVar47 = vmaxss_avx(ZEXT416((uint)(((fVar54 - fVar51) - fVar53) + fVar52)),
                               ZEXT816(0) << 0x40);
          iVar42 = iVar34 + 1;
          if (iVar28 < iVar34 + 1) {
            iVar42 = iVar28;
          }
          iVar35 = iVar42 + -1;
          iVar19 = iVar34 + 1 + iVar11;
          if (iVar28 <= iVar19) {
            iVar19 = iVar28;
          }
          fVar51 = 0.0;
          auVar56 = vmaxss_avx(ZEXT416((uint)(fVar59 + ((auVar56._0_4_ - fVar55) - fVar57))),
                               ZEXT816(0) << 0x40);
          auVar56 = vfmadd132ss_fma(auVar56,auVar47,SUB6416(ZEXT464(0xc0400000),0));
          fVar54 = 0.0;
          if ((0 < iVar38) && (0 < iVar42)) {
            fVar54 = pfVar8[iVar25 + iVar35];
          }
          iVar30 = iVar19 + -1;
          if ((0 < iVar38) && (0 < iVar19)) {
            fVar51 = pfVar8[iVar25 + iVar30];
          }
          fVar52 = 0.0;
          fVar53 = 0.0;
          if (0 < iVar17 && 0 < iVar42) {
            fVar53 = pfVar8[iVar26 + iVar35];
          }
          if ((0 < iVar17) && (0 < iVar19)) {
            fVar52 = pfVar8[iVar26 + iVar30];
          }
          iVar31 = -iVar11 + iVar34;
          if (iVar28 < iVar31) {
            iVar31 = iVar28;
          }
          iVar41 = iVar31 + -1;
          iVar36 = iVar28;
          if (iVar34 < iVar28) {
            iVar36 = iVar34;
          }
          fVar55 = 0.0;
          if ((0 < iVar18) && (0 < iVar31)) {
            fVar55 = pfVar8[iVar29 + iVar41];
          }
          iVar43 = iVar36 + -1;
          fVar57 = 0.0;
          if ((0 < iVar18) && (0 < iVar36)) {
            fVar57 = pfVar8[iVar29 + iVar43];
          }
          fVar58 = 0.0;
          fVar59 = 0.0;
          if ((0 < iVar5) && (0 < iVar31)) {
            fVar59 = pfVar8[iVar39 + iVar41];
          }
          if ((0 < iVar5) && (0 < iVar36)) {
            fVar58 = pfVar8[iVar39 + iVar43];
          }
          auVar47 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar47);
          if ((0 < iVar38) && (0 < iVar31)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar25 + iVar41]);
          }
          auVar47 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar47);
          if ((0 < iVar38) && (0 < iVar36)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar25 + iVar43]);
          }
          auVar47 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar47);
          auVar47 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar47);
          if ((0 < iVar17) && (0 < iVar31)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar41 + iVar26]);
          }
          if (0 < iVar17 && 0 < iVar36) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar43 + iVar26]);
          }
          auVar47 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar47);
          if ((0 < iVar18) && (0 < iVar42)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar29 + iVar35]);
          }
          auVar47 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar47);
          if ((0 < iVar18) && (0 < iVar19)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar29 + iVar30]);
          }
          auVar47 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar47);
          auVar47 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar47);
          if ((0 < iVar5) && (0 < iVar42)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar35 + iVar39]);
          }
          if ((0 < iVar5) && (0 < iVar19)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar30 + iVar39]);
          }
          auVar47 = vmaxss_avx(ZEXT416((uint)(fVar52 + ((fVar54 - fVar51) - fVar53))),
                               ZEXT816(0) << 0x40);
          auVar10 = vmaxss_avx(ZEXT416((uint)(fVar58 + ((fVar55 - fVar57) - fVar59))),
                               ZEXT816(0) << 0x40);
          auVar48 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar48 = vsubss_avx512f(auVar48,in_ZMM19._0_16_);
          auVar48 = vaddss_avx512f(auVar48,in_ZMM18._0_16_);
          auVar49 = vmaxss_avx512f(auVar48,auVar46);
          auVar48 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar48 = vsubss_avx512f(auVar48,in_ZMM24._0_16_);
          auVar48 = vaddss_avx512f(auVar48,in_ZMM23._0_16_);
          auVar48 = vmaxss_avx(auVar48,ZEXT816(0) << 0x40);
          fVar54 = fVar50 * auVar9._0_4_;
          fVar51 = fVar50 * auVar56._0_4_;
          fVar53 = fVar50 * (((auVar47._0_4_ + auVar10._0_4_) - auVar49._0_4_) - auVar48._0_4_);
          auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53 * -0.81)),ZEXT416((uint)fVar54),
                                    ZEXT416((uint)fVar51));
          pfVar6[iVar37 + lVar44] = auVar56._0_4_;
          pbVar7[lVar44 + iVar37] = 0.0 <= fVar54 + fVar51;
          lVar44 = lVar44 + 1;
          iVar34 = iVar34 + iVar2;
        } while (iVar4 != (int)lVar44);
        iVar37 = iVar37 + (int)lVar44;
      }
      iVar20 = iVar20 + 1;
    } while (iVar20 != iVar1);
  }
  return;
}

Assistant:

void compute_response_layer(struct response_layer* layer, struct integral_image* iimage) {
    float Dxx, Dyy, Dxy;
    int x, y;

    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);

    for (int i = 0, ind = 0; i < height; ++i) {
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            x = i*step;
            y = j*step;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
        }
    }

}